

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v4.cpp
# Opt level: O1

ssize_t __thiscall
LASwriteItemCompressed_BYTE14_v4::write
          (LASwriteItemCompressed_BYTE14_v4 *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  ulong uVar5;
  U8 *item;
  
  uVar4 = (ulong)this->current_context;
  item = this->contexts[uVar4].last_item;
  uVar3 = *__buf;
  if (this->current_context != uVar3) {
    this->current_context = uVar3;
    if (this->contexts[uVar3].unused == true) {
      createAndInitModelsAndCompressors(this,uVar3,item);
    }
    uVar4 = (ulong)this->current_context * 3;
    item = this->contexts[this->current_context].last_item;
  }
  if (this->number != 0) {
    uVar5 = 0;
    do {
      bVar1 = *(byte *)(CONCAT44(in_register_00000034,__fd) + uVar5);
      bVar2 = item[uVar5];
      uVar3 = (uint)bVar1 - (uint)bVar2;
      ArithmeticEncoder::encodeSymbol
                (this->enc_Bytes[uVar5],this->contexts[this->current_context].m_bytes[uVar5],
                 (uVar3 >> 0x17 & 0x100) + uVar3);
      if (bVar1 != bVar2) {
        this->changed_Bytes[uVar5] = true;
        item[uVar5] = *(U8 *)(CONCAT44(in_register_00000034,__fd) + uVar5);
      }
      uVar5 = uVar5 + 1;
      uVar4 = (ulong)this->number;
    } while (uVar5 < uVar4);
  }
  return CONCAT71((int7)(uVar4 >> 8),1);
}

Assistant:

inline BOOL LASwriteItemCompressed_BYTE14_v4::write(const U8* item, U32& context)
{
  // get last

  U8* last_item = contexts[current_context].last_item;

  // check for context switch

  if (current_context != context)
  {
    current_context = context; // all other items use context set by POINT14 writer
    if (contexts[current_context].unused)
    {
      createAndInitModelsAndCompressors(current_context, last_item);
    }
    last_item = contexts[current_context].last_item;
  }

  // compress

  U32 i;
  I32 diff;
  for (i = 0; i < number; i++)
  {
    diff = item[i] - last_item[i];
    enc_Bytes[i]->encodeSymbol(contexts[current_context].m_bytes[i], U8_FOLD(diff));
    if (diff)
    {
      changed_Bytes[i] = TRUE;
      last_item[i] = item[i];
    }
  }
  return TRUE;
}